

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelInternalFormatCase::checkTextureState
          (TextureLevelInternalFormatCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  ostringstream *poVar1;
  int level;
  int expected;
  GLenum GVar2;
  QueryType QVar3;
  pointer pTVar4;
  bool bVar5;
  bool bVar6;
  qpTestResult qVar7;
  DataType DVar8;
  pointer pTVar9;
  GLfloat *pGVar10;
  GLint *pGVar11;
  long lVar12;
  long lVar13;
  Enum<int,_2UL> *pEVar14;
  ResultCollector result;
  QueriedState state;
  MessageBuilder msg;
  ResultCollector result_1;
  Enum<int,_2UL> local_3f0;
  Enum<int,_2UL> local_3e0;
  long local_3d0 [2];
  ResultCollector local_3c0;
  TextureLevelInternalFormatCase *local_370;
  TextureGenerationSpec *local_368;
  QueriedState local_360;
  Enum<int,_2UL> local_338;
  undefined1 local_328 [120];
  ios_base local_2b0 [264];
  ResultCollector local_1a8;
  ios_base local_138 [264];
  
  pTVar9 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar9 != pTVar4) {
    if (0 < (int)((ulong)((long)pTVar4 - (long)pTVar9) >> 3) * -0x55555555) {
      poVar1 = (ostringstream *)(local_328 + 8);
      bVar6 = true;
      lVar13 = 0x10;
      lVar12 = 0;
      local_370 = this;
      local_368 = spec;
      do {
        level = *(int *)((long)pTVar9 + lVar13 + -4);
        expected = *(int *)((long)&pTVar9->width + lVar13);
        GVar2 = spec->queryTarget;
        QVar3 = (local_370->super_TextureLevelCase).m_type;
        gls::StateQueryUtil::QueriedState::QueriedState(&local_360);
        local_328._16_7_ = 0x525245202f2f20;
        local_328._23_4_ = 0x203a524f;
        local_328._8_8_ = 0xb;
        local_328[0x1b] = '\0';
        local_328._0_8_ = local_328 + 0x10;
        tcu::ResultCollector::ResultCollector(&local_3c0,gl->m_log,(string *)local_328);
        if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
          operator_delete((void *)local_328._0_8_,CONCAT17(local_328[0x17],local_328._16_7_) + 1);
        }
        local_328._0_8_ = gl->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying ",10);
        local_338.m_getName = glu::getTextureLevelParameterName;
        local_338.m_value = 0x1003;
        tcu::Format::Enum<int,_2UL>::toStream(&local_338,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expecting ",0xc);
        local_3f0.m_getName = glu::getTextureFormatName;
        local_3f0.m_value = expected;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        tcu::Format::Enum<int,_2UL>::toStream(&local_3f0,(ostream *)&local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   (char *)CONCAT44(local_3e0.m_getName._4_4_,local_3e0.m_getName._0_4_),
                   local_3e0._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((long *)CONCAT44(local_3e0.m_getName._4_4_,local_3e0.m_getName._0_4_) != local_3d0) {
          operator_delete((long *)CONCAT44(local_3e0.m_getName._4_4_,local_3e0.m_getName._0_4_),
                          local_3d0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_2b0);
        gls::StateQueryUtil::queryTextureLevelState
                  (&local_3c0,gl,QVar3,GVar2,level,0x1003,&local_360);
        spec = local_368;
        bVar5 = gls::StateQueryUtil::QueriedState::isUndefined(&local_360);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          gls::StateQueryUtil::verifyInteger(&local_3c0,&local_360,expected);
          qVar7 = tcu::ResultCollector::getResult(&local_3c0);
          bVar5 = qVar7 == QP_TEST_RESULT_PASS;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0.m_message._M_dataplus._M_p != &local_3c0.m_message.field_2) {
          operator_delete(local_3c0.m_message._M_dataplus._M_p,
                          local_3c0.m_message.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0.m_prefix._M_dataplus._M_p != &local_3c0.m_prefix.field_2) {
          operator_delete(local_3c0.m_prefix._M_dataplus._M_p,
                          local_3c0.m_prefix.field_2._M_allocated_capacity + 1);
        }
        bVar6 = (bool)(bVar6 & bVar5);
        lVar12 = lVar12 + 1;
        pTVar9 = (spec->levels).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x18;
      } while (lVar12 < (int)((ulong)((long)(spec->levels).
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar9) >> 3) * -0x55555555);
      return bVar6;
    }
    return true;
  }
  local_3e0.m_getName._0_4_ = 0x1908;
  local_3f0.m_getName = (GetNameFunc)CONCAT44(local_3f0.m_getName._4_4_,0x8229);
  GVar2 = spec->queryTarget;
  QVar3 = (this->super_TextureLevelCase).m_type;
  gls::StateQueryUtil::QueriedState::QueriedState((QueriedState *)&local_3c0);
  local_328._16_7_ = 0x525245202f2f20;
  local_328._23_4_ = 0x203a524f;
  local_328._8_8_ = 0xb;
  local_328[0x1b] = '\0';
  local_328._0_8_ = local_328 + 0x10;
  tcu::ResultCollector::ResultCollector(&local_1a8,gl->m_log,(string *)local_328);
  if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,CONCAT17(local_328[0x17],local_328._16_7_) + 1);
  }
  local_328._0_8_ = gl->m_log;
  poVar1 = (ostringstream *)(local_328 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying ",10);
  local_360._0_8_ = glu::getTextureLevelParameterName;
  local_360.m_v.vFloat = 5.74392e-42;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_360,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expecting any of {",0x14);
  pEVar14 = &local_3e0;
  bVar6 = true;
  do {
    bVar5 = bVar6;
    if (!bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    }
    local_360.m_v.vInt = *(undefined4 *)&pEVar14->m_getName;
    local_360._0_8_ = glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_360,(ostream *)poVar1);
    pEVar14 = &local_3f0;
    bVar6 = false;
  } while (bVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"}",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  gls::StateQueryUtil::queryTextureLevelState
            (&local_1a8,gl,QVar3,GVar2,0,0x1003,(QueriedState *)&local_3c0);
  bVar6 = gls::StateQueryUtil::QueriedState::isUndefined((QueriedState *)&local_3c0);
  if (!bVar6) {
    DVar8 = gls::StateQueryUtil::QueriedState::getType((QueriedState *)&local_3c0);
    if (DVar8 == DATATYPE_INTEGER) {
      pEVar14 = &local_3e0;
      bVar6 = true;
      do {
        bVar5 = bVar6;
        pGVar11 = gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3c0);
        if (*pGVar11 == *(int *)&pEVar14->m_getName) goto LAB_004ae993;
        pEVar14 = &local_3f0;
        bVar6 = false;
      } while (bVar5);
      local_328._0_8_ = gl->m_log;
      poVar1 = (ostringstream *)(local_328 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Error: got ",0xb);
      pGVar11 = gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3c0);
      std::ostream::operator<<(poVar1,*pGVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", (",3);
      pGVar10 = (GLfloat *)
                gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3c0);
      local_360.m_v.vInt = (GLint)*pGVar10;
      local_360._0_8_ = glu::getTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_360,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (DVar8 != DATATYPE_FLOAT) goto LAB_004ae93b;
      pEVar14 = &local_3e0;
      bVar6 = true;
      do {
        bVar5 = bVar6;
        pGVar10 = gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3c0);
        if ((*pGVar10 == (float)*(int *)&pEVar14->m_getName) &&
           (!NAN(*pGVar10) && !NAN((float)*(int *)&pEVar14->m_getName))) goto LAB_004ae993;
        pEVar14 = &local_3f0;
        bVar6 = false;
      } while (bVar5);
      local_328._0_8_ = gl->m_log;
      poVar1 = (ostringstream *)(local_328 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Error: got ",0xb);
      pGVar10 = gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3c0);
      std::ostream::_M_insert<double>((double)*pGVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", (",3);
      pGVar10 = gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3c0);
      local_360.m_v.vInt = (GLint)*pGVar10;
      local_360._0_8_ = glu::getTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_360,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
    std::ios_base::~ios_base(local_2b0);
  }
LAB_004ae93b:
  bVar6 = false;
LAB_004ae93d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_message._M_dataplus._M_p != &local_1a8.m_message.field_2) {
    operator_delete(local_1a8.m_message._M_dataplus._M_p,
                    local_1a8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_prefix._M_dataplus._M_p != &local_1a8.m_prefix.field_2) {
    operator_delete(local_1a8.m_prefix._M_dataplus._M_p,
                    local_1a8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
LAB_004ae993:
  bVar6 = true;
  goto LAB_004ae93d;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			const int queryLevel		= 0;
			const int initialValues[2]	= { GL_RGBA, GL_R8 };

			allOk &= verifyTextureLevelParameterInternalFormatAnyOf(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, initialValues, DE_LENGTH_OF_ARRAY(initialValues), m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].internalFormat;

				allOk &= verifyTextureLevelParameterInternalFormatEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, refValue, m_type);
			}
		}

		return allOk;
	}